

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O1

void Kit_PlaToTruth(char *pSop,int nVars,Vec_Ptr_t *vVars,uint *pTemp,uint *pTruth)

{
  char cVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  
  if (pSop == (char *)0x0) {
    __assert_fail("pSop != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,499,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,500,
                  "void Kit_PlaToTruth(char *, int, Vec_Ptr_t *, unsigned int *, unsigned int *)");
  }
  sVar5 = strlen(pSop);
  uVar7 = (ulong)(nVars + 3);
  if (sVar5 % uVar7 != 0) {
    puts("Kit_PlaToTruth(): SOP is represented incorrectly.");
    return;
  }
  uVar3 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar3 = 1;
  }
  uVar12 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    memset(pTruth,0,uVar12 * 4);
  }
  sVar5 = strlen(pSop);
  iVar11 = 0;
  iVar4 = (int)(sVar5 / uVar7);
  if (iVar4 < 1) {
    bVar13 = true;
  }
  else {
    uVar9 = 1;
    if (1 < nVars) {
      uVar9 = (ulong)(uint)nVars;
    }
    lVar10 = uVar12 + 1;
    do {
      cVar1 = pSop[(ulong)(uint)nVars + 1];
      if (0 < (int)uVar3) {
        memset(pTemp,0xff,uVar12 * 4);
      }
      if (nVars != 0) {
        uVar6 = 0;
        do {
          if (pSop[uVar6] == '0') {
            if ((long)vVars->nSize <= (long)uVar6) {
LAB_005d2771:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (0 < (int)uVar3) {
              pvVar2 = vVars->pArray[uVar6];
              lVar8 = lVar10;
              do {
                pTemp[lVar8 + -2] = pTemp[lVar8 + -2] & ~*(uint *)((long)pvVar2 + lVar8 * 4 + -8);
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
            }
          }
          else if (pSop[uVar6] == '1') {
            if ((long)vVars->nSize <= (long)uVar6) goto LAB_005d2771;
            if (0 < (int)uVar3) {
              pvVar2 = vVars->pArray[uVar6];
              lVar8 = lVar10;
              do {
                pTemp[lVar8 + -2] = pTemp[lVar8 + -2] & *(uint *)((long)pvVar2 + lVar8 * 4 + -8);
                lVar8 = lVar8 + -1;
              } while (1 < lVar8);
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar9);
      }
      lVar8 = lVar10;
      if (0 < (int)uVar3) {
        do {
          pTruth[lVar8 + -2] = pTruth[lVar8 + -2] | pTemp[lVar8 + -2];
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
      pSop = pSop + uVar7;
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar4);
    bVar13 = cVar1 != '0';
  }
  if ((0 < (int)uVar3) && (!bVar13)) {
    lVar10 = uVar12 + 1;
    do {
      pTruth[lVar10 + -2] = ~pTruth[lVar10 + -2];
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  return;
}

Assistant:

void Kit_PlaToTruth( char * pSop, int nVars, Vec_Ptr_t * vVars, unsigned * pTemp, unsigned * pTruth )
{
    int v, c, nCubes, fCompl = 0;
    assert( pSop != NULL );
    assert( nVars >= 0 );
    if ( strlen(pSop) % (nVars + 3) != 0 )
    {
        printf( "Kit_PlaToTruth(): SOP is represented incorrectly.\n" );
        return;
    }
    // iterate through the cubes
    Kit_TruthClear( pTruth, nVars );
    nCubes =  strlen(pSop) / (nVars + 3);
    for ( c = 0; c < nCubes; c++ )
    {
        fCompl = (pSop[nVars+1] == '0');
        Kit_TruthFill( pTemp, nVars );
        // iterate through the literals of the cube
        for ( v = 0; v < nVars; v++ )
            if ( pSop[v] == '1' )
                Kit_TruthAnd( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
            else if ( pSop[v] == '0' )
                Kit_TruthSharp( pTemp, pTemp, (unsigned *)Vec_PtrEntry(vVars, v), nVars );
        // add cube to storage
        Kit_TruthOr( pTruth, pTruth, pTemp, nVars );
        // go to the next cube
        pSop += (nVars + 3);
    }
    if ( fCompl )
        Kit_TruthNot( pTruth, pTruth, nVars );
}